

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall IRBuilder::InsertInitLoopBodyLoopCounter(IRBuilder *this,uint loopNum)

{
  code *pcVar1;
  bool bVar2;
  uint offset;
  undefined4 *puVar3;
  JITTimeFunctionBody *this_00;
  intptr_t iVar4;
  intptr_t iVar5;
  StackSym *sym;
  RegOpnd *this_01;
  Instr *instr;
  
  bVar2 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1e46,"(this->IsLoopBody())","this->IsLoopBody()");
    if (!bVar2) goto LAB_004d4baa;
    *puVar3 = 0;
  }
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  iVar4 = JITTimeFunctionBody::GetLoopHeaderAddr(this_00,loopNum);
  iVar5 = JITTimeWorkItem::GetLoopHeaderAddr(this->m_func->m_workItem);
  if (iVar5 != iVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1e49,"(m_func->GetWorkItem()->GetLoopHeaderAddr() == loopHeader)",
                       "m_func->GetWorkItem()->GetLoopHeaderAddr() == loopHeader");
    if (!bVar2) {
LAB_004d4baa:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  sym = StackSym::New(TyVar,this->m_func);
  this->m_loopCounterSym = sym;
  this_01 = IR::RegOpnd::New(sym,TyVar,this->m_func);
  IR::Opnd::SetIsJITOptimizedReg(&this_01->super_Opnd,true);
  instr = IR::Instr::New(InitLoopBodyCount,&this_01->super_Opnd,this->m_func);
  IR::Instr::InsertAfter(this->m_lastInstr,instr);
  this->m_lastInstr = instr;
  offset = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader);
  IR::Instr::SetByteCodeOffset(instr,offset);
  return;
}

Assistant:

void
IRBuilder::InsertInitLoopBodyLoopCounter(uint loopNum)
{
    Assert(this->IsLoopBody());

    intptr_t loopHeader = m_func->GetJITFunctionBody()->GetLoopHeaderAddr(loopNum);
    Assert(m_func->GetWorkItem()->GetLoopHeaderAddr() == loopHeader);  //Init only once

    m_loopCounterSym = StackSym::New(TyVar, this->m_func);

    IR::RegOpnd* loopCounterOpnd = IR::RegOpnd::New(m_loopCounterSym, TyVar, this->m_func);
    loopCounterOpnd->SetIsJITOptimizedReg(true);

    IR::Instr * initInstr = IR::Instr::New(Js::OpCode::InitLoopBodyCount, loopCounterOpnd, this->m_func);
    m_lastInstr->InsertAfter(initInstr);
    m_lastInstr = initInstr;
    initInstr->SetByteCodeOffset(m_jnReader.GetCurrentOffset());
}